

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O3

int AF_A_CheckThrowBomb2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double dVar2;
  VM_UBYTE VVar3;
  undefined8 *puVar4;
  double dVar5;
  double dVar6;
  PClass *pPVar7;
  int iVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  uint uVar10;
  FString *this;
  VMValue *pVVar11;
  char *__assertion;
  AActor *this_00;
  long lVar12;
  bool bVar13;
  bool bVar14;
  VMValue params [3];
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005dee2b;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_005dec49:
        this_00 = (AActor *)0x0;
        pVVar11 = param;
        uVar10 = numparam;
      }
      else {
        pPVar9 = (this_00->super_DThinker).super_DObject.Class;
        if (pPVar9 == (PClass *)0x0) {
          iVar8 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
          pPVar9 = (PClass *)CONCAT44(extraout_var,iVar8);
          (this_00->super_DThinker).super_DObject.Class = pPVar9;
        }
        bVar13 = pPVar9 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar13;
        bVar14 = pPVar9 == pPVar7;
        if (!bVar14 && !bVar13) {
          do {
            pPVar9 = pPVar9->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar9 != (PClass *)0x0);
            if (pPVar9 == pPVar7) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        pVVar11 = (VMValue *)(ulong)(bVar14 || bVar13);
        uVar10 = (uint)bVar13;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005dee2b;
        }
      }
      pPVar7 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005ded11;
      VVar3 = param[1].field_0.field_3.Type;
      if (VVar3 != 0xff) {
        if (VVar3 != '\x03') goto LAB_005dee1b;
        puVar4 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar4 != (undefined8 *)0x0) {
            pPVar9 = (PClass *)puVar4[1];
            if (pPVar9 == (PClass *)0x0) {
              pPVar9 = (PClass *)(**(code **)*puVar4)(puVar4,pVVar11,uVar10,ret);
              puVar4[1] = pPVar9;
            }
            bVar13 = pPVar9 != (PClass *)0x0;
            if (pPVar9 != pPVar7 && bVar13) {
              do {
                pPVar9 = pPVar9->ParentClass;
                bVar13 = pPVar9 != (PClass *)0x0;
                if (pPVar9 == pPVar7) break;
              } while (pPVar9 != (PClass *)0x0);
            }
            if (!bVar13) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005dee2b;
            }
          }
        }
        else if (puVar4 != (undefined8 *)0x0) goto LAB_005dee1b;
      }
      if (((numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
         ((VVar3 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005ded11:
        dVar2 = (this_00->Vel).Z;
        if ((dVar2 < 2.0) &&
           (dVar5 = (this_00->Vel).X, dVar6 = (this_00->Vel).Y,
           dVar2 * dVar2 + dVar6 * dVar6 + dVar5 * dVar5 < 2.25)) {
          AActor::SetState(this_00,this_00->SpawnState + 6,false);
          (this_00->__Pos).Z = this_00->floorz;
          (this_00->Vel).Z = 0.0;
          (this_00->BounceFlags).Value = 0;
          pbVar1 = (byte *)((long)&(this_00->flags).Value + 2);
          *pbVar1 = *pbVar1 & 0xfe;
        }
        local_68.field_1.atag = 1;
        local_68.field_3.Type = '\x03';
        local_50 = 1;
        local_4c = 3;
        local_48.Chars = (char *)0x0;
        local_40 = 8;
        local_3c[0] = 3;
        local_68.field_1.a = this_00;
        local_58 = this_00;
        VMFrameStack::Call(stack,&A_CheckThrowBomb_VMPtr->super_VMFunction,
                           (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
        lVar12 = -0x30;
        this = &local_48;
        do {
          if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
            FString::~FString(this);
          }
          this = this + -2;
          lVar12 = lVar12 + 0x10;
        } while (lVar12 != 0);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005dee2b;
    }
    if (this_00 == (AActor *)0x0) goto LAB_005dec49;
  }
LAB_005dee1b:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005dee2b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x1ba,"int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckThrowBomb2)
{
	PARAM_ACTION_PROLOGUE;

	// [RH] Check using actual velocity, although the vel.z < 2 check still stands
	if (self->Vel.Z < 2 && self->Vel.LengthSquared() < (9./4.))
	{
		self->SetState (self->SpawnState + 6);
		self->SetZ(self->floorz);
		self->Vel.Z = 0;
		self->BounceFlags = BOUNCE_None;
		self->flags &= ~MF_MISSILE;
	}
	CALL_ACTION(A_CheckThrowBomb, self);
	return 0;
}